

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O1

int __thiscall
icu_63::GregorianCalendar::clone
          (GregorianCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  Calendar *this_00;
  
  this_00 = (Calendar *)UMemory::operator_new((UMemory *)0x290,(size_t)__fn);
  if (this_00 == (Calendar *)0x0) {
    this_00 = (Calendar *)0x0;
  }
  else {
    Calendar::Calendar(this_00,&this->super_Calendar);
    (this_00->super_UObject)._vptr_UObject = (_func_int **)&PTR__GregorianCalendar_00478298;
    this_00[1].super_UObject._vptr_UObject = (_func_int **)this->fGregorianCutover;
    uVar1 = *(undefined1 *)((long)&this->fCutoverJulianDay + 1);
    uVar2 = *(undefined1 *)((long)&this->fCutoverJulianDay + 2);
    uVar3 = *(undefined1 *)((long)&this->fCutoverJulianDay + 3);
    this_00[1].fIsTimeSet = *(undefined1 *)&this->fCutoverJulianDay;
    this_00[1].fAreFieldsSet = uVar1;
    this_00[1].fAreAllFieldsSet = uVar2;
    this_00[1].fAreFieldsVirtuallySet = uVar3;
    *(UDate *)(this_00[1].fFields + 1) = this->fNormalizedGregorianCutover;
    this_00[1].fFields[3] = this->fGregorianCutoverYear;
    *(UBool *)(this_00[1].fFields + 5) = this->fIsGregorian;
    *(UBool *)((long)this_00[1].fFields + 0x15) = this->fInvertGregorian;
  }
  return (int)this_00;
}

Assistant:

Calendar* GregorianCalendar::clone() const
{
    return new GregorianCalendar(*this);
}